

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildIdentifier(CNscPStackEntry *pId)

{
  byte *pbVar1;
  size_t *psVar2;
  NscType nType;
  uchar *puVar3;
  uint ulFlags;
  CNscPStackEntry *this;
  NscSymbol *pNVar4;
  char *pcVar5;
  NscMessage nMessage;
  int nStackOffset;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pId != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pId->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this,NscType_Unknown);
    return this;
  }
  pNVar4 = CNscContext::FindDeclSymbol(g_pCtx,pId->m_pszId);
  if (pNVar4 == (NscSymbol *)0x0) {
    pcVar5 = pId->m_pszId;
    nMessage = NscMessage_ErrorUndeclaredIdentifier;
  }
  else {
    ulFlags = (pNVar4->field_6).field_2.ulFlags;
    if ((ulFlags & 0x11000000) == 0x10000000) {
      CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningIdentUsedInInitializer,pNVar4->szString)
      ;
      ulFlags = (pNVar4->field_6).field_2.ulFlags | 0x1000000;
      (pNVar4->field_6).field_2.ulFlags = ulFlags;
    }
    if (pNVar4->nSymType == NscSymType_Structure) {
      pcVar5 = pId->m_pszId;
      nMessage = NscMessage_ErrorInvalidUseOfStructure;
    }
    else {
      if (pNVar4->nSymType != NscSymType_Function) {
        puVar3 = (g_pCtx->m_sSymbols).m_pauchData;
        if ((char)ulFlags < '\0') {
          psVar2 = (size_t *)(puVar3 + (pNVar4->field_6).field_1.nFirstBackLink);
          CNscPStackEntry::AppendData(this,psVar2 + 2,*psVar2);
        }
        else {
          nType = (pNVar4->field_6).field_2.nType;
          if ((ulFlags & 1) == 0) {
            nStackOffset = (pNVar4->field_6).field_2.nStackOffset;
          }
          else {
            nStackOffset = 0;
          }
          CNscPStackEntry::PushVariable
                    (this,nType,nType,(long)pNVar4 - (long)puVar3,-1,nStackOffset,ulFlags);
        }
        CNscPStackEntry::SetType(this,(pNVar4->field_6).field_2.nType);
        pbVar1 = (byte *)((long)&pNVar4->field_6 + 7);
        *pbVar1 = *pbVar1 | 4;
        goto LAB_0015ec63;
      }
      pcVar5 = pId->m_pszId;
      nMessage = NscMessage_ErrorInvalidUseOfFunction;
    }
  }
  CNscContext::GenerateMessage(g_pCtx,nMessage,pcVar5);
  CNscPStackEntry::SetType(this,NscType_Error);
LAB_0015ec63:
  CNwnDoubleLinkList::InsertAfter(&pId->m_link,&g_pCtx->m_listEntryFree);
  return this;
}

Assistant:

YYSTYPE NscBuildIdentifier (YYSTYPE pId)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pId)
			g_pCtx ->FreePStackEntry (pId);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Search for the identifier
	//

	NscSymbol *pSymbol = g_pCtx ->FindDeclSymbol (pId ->GetIdentifier ());
	
	//
	// If the identifier wasn't found
	//

	if (pSymbol == NULL)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorUndeclaredIdentifier,
			pId ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we have a good symbol
	//

	else
	{
		//
		// If we are defining the variable, the issue a warning and push the
		// default value (we can't reference the variable itself as it does not
		// yet have stack space allocated!).
		//

		if ((pSymbol ->ulFlags & NscSymFlag_BeingDefined) != 0)
		{
			if ((pSymbol ->ulFlags & NscSymFlag_SelfReferenceDef) == 0)
			{
				g_pCtx ->GenerateMessage (NscMessage_WarningIdentUsedInInitializer,
					pSymbol ->szString);
				pSymbol ->ulFlags |= NscSymFlag_SelfReferenceDef;
			}
		}

		//
		// If the symbol is a function
		//

		if (pSymbol ->nSymType == NscSymType_Function)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorInvalidUseOfFunction,
				pId ->GetIdentifier ());
			pOut ->SetType (NscType_Error);
		}

		//
		// If the symbol is a structure
		//

		else if (pSymbol ->nSymType == NscSymType_Structure)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorInvalidUseOfStructure,
				pId ->GetIdentifier ());
			pOut ->SetType (NscType_Error);
		}

		//
		// Otherwise, just a simple variable and not taken care of by default
		// initialization
		//

		else
		{

			//
			// Get the symbol offset
			//

			size_t nSymbol = g_pCtx ->GetSymbolOffset (pSymbol);

			//
			// If the symbol is a constant, then copy the initialization
			// code
			//

			if ((pSymbol ->ulFlags & NscSymFlag_Constant) != 0)
			{
				unsigned char *pauchInit = g_pCtx ->GetSymbolData (pSymbol ->nExtra);
				NscSymbolVariableExtra *pExtra = (NscSymbolVariableExtra *) pauchInit;
				pauchInit += sizeof (NscSymbolVariableExtra);
				pOut ->AppendData (pauchInit, pExtra ->nInitSize);
			}

			//
			// If the symbol is a global, push the variable
			//

			else if ((pSymbol ->ulFlags & NscSymFlag_Global) != 0)
			{
				pOut ->PushVariable (pSymbol ->nType, pSymbol ->nType, 
					nSymbol, -1, 0, pSymbol ->ulFlags);
			}

			//
			// If the symbol is a local, push the variable
			//

			else
			{
				pOut ->PushVariable (pSymbol ->nType, pSymbol ->nType, 
					nSymbol, -1, pSymbol ->nStackOffset, 
					pSymbol ->ulFlags);
			}

			//
			// Set the type
			//

			pOut ->SetType (pSymbol ->nType);

			//
			// Mark the symbol as referenced already (by the parser)
			//

			NscParserReferenceSymbol (pSymbol);
		}
	}

	//
	// Delete the input entry
	//

	g_pCtx ->FreePStackEntry (pId);
	return pOut;
}